

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

void helicsPublicationPublishDataBuffer
               (HelicsPublication pub,HelicsDataBuffer buffer,HelicsError *err)

{
  PublicationObject *pPVar1;
  SmallBuffer *pSVar2;
  defV pubVal;
  data_view local_68;
  _Variadic_union<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  local_48;
  undefined1 local_20;
  
  pPVar1 = anon_unknown.dwarf_7c49a::verifyPublication(pub,err);
  if (pPVar1 != (PublicationObject *)0x0) {
    pSVar2 = getBuffer(buffer);
    if (pSVar2 == (SmallBuffer *)0x0) {
      helics::Publication::publishString(pPVar1->pubPtr,(string_view)(ZEXT816(0x43a1a2) << 0x40));
    }
    else {
      local_48._M_first._M_storage = (_Uninitialized<double,_true>)0.0;
      local_20 = 0;
      local_68.dblock._M_len = pSVar2->bufferSize;
      local_68.dblock._M_str = (char *)pSVar2->heap;
      local_68.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      local_68.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      helics::valueExtract(&local_68,HELICS_UNKNOWN,(defV *)&local_48._M_first);
      if (local_68.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.ref.
                   super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      helics::Publication::publishDefV(pPVar1->pubPtr,(defV *)&local_48._M_first);
      std::__detail::__variant::
      _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)&local_48._M_first);
    }
  }
  return;
}

Assistant:

void helicsPublicationPublishDataBuffer(HelicsPublication pub, HelicsDataBuffer buffer, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        auto* buff = getBuffer(buffer);
        if (buff == nullptr) {
            pubObj->pubPtr->publish("");
            return;
        }
        helics::defV pubVal;
        helics::valueExtract(helics::data_view(*buff), helics::DataType::HELICS_UNKNOWN, pubVal);
        pubObj->pubPtr->publish(pubVal);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}